

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlocalserver.cpp
# Opt level: O1

void QLocalServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  long lVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QFlagsStorage<QLocalServer::SocketOption> local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      QLocalServerPrivate::_q_onNewConnection(*(QLocalServerPrivate **)(_o + 8));
    }
    else if (_id == 0) {
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
    }
    if (_c == ReadProperty) goto switchD_002432f3_caseD_1;
    if (_c == WriteProperty) goto switchD_002432f3_caseD_2;
    if (_c == IndexOfMethod) goto switchD_002432f3_caseD_5;
    break;
  case ReadProperty:
switchD_002432f3_caseD_1:
    if (_id == 0) {
      puVar1 = (undefined4 *)*_a;
      lVar2 = *(long *)(_o + 8);
      if ((*(long **)(lVar2 + 0x48) != (long *)0x0) && (**(long **)(lVar2 + 0x48) != 0)) {
        QBindingStorage::registerDependency_helper((QUntypedPropertyData *)(lVar2 + 0x40));
      }
      *puVar1 = *(undefined4 *)(lVar2 + 0xf8);
    }
    if (_c == WriteProperty && _id == 0) {
LAB_002433ab:
      local_3c.i = **_a;
      QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
      ::setValue((QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
                  *)(*(long *)(_o + 8) + 0xf8),(parameter_type)&local_3c);
    }
    break;
  case WriteProperty:
switchD_002432f3_caseD_2:
    if (_id == 0) goto LAB_002433ab;
    break;
  case IndexOfMethod:
switchD_002432f3_caseD_5:
    if ((*_a[1] == newConnection) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto LAB_002433e8;
    }
    if (_c == WriteProperty) goto switchD_002432f3_caseD_2;
    if (_c == ReadProperty) goto switchD_002432f3_caseD_1;
  }
  if (_c == BindableProperty && _id == 0) {
    plVar3 = (long *)*_a;
    *plVar3 = *(long *)(_o + 8) + 0xf8;
    plVar3[1] = (long)&QtPrivate::
                       QBindableInterfaceForProperty<QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>,_void>
                       ::iface;
  }
LAB_002433e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLocalServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->newConnection(); break;
        case 1: _t->d_func()->_q_onNewConnection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLocalServer::*)()>(_a, &QLocalServer::newConnection, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<SocketOptions>(_v, _t->socketOptions()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSocketOptions(*reinterpret_cast<SocketOptions*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSocketOptions(); break;
        default: break;
        }
    }
}